

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O1

void resizestack(lua_State *L,MSize n)

{
  uint *puVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  void *pvVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  void *p;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar16 [16];
  
  p = (void *)(ulong)(L->stack).ptr32;
  uVar6 = L->stacksize;
  uVar8 = (ulong)uVar6;
  uVar10 = n + 6;
  pvVar7 = lj_mem_realloc(L,p,uVar6 * 8,n * 8 + 0x30);
  (L->stack).ptr32 = (uint32_t)pvVar7;
  lVar9 = (long)pvVar7 - (long)p;
  (L->maxstack).ptr32 = (uint32_t)pvVar7 + n * 8;
  auVar5 = _DAT_00157190;
  auVar4 = _DAT_00157180;
  auVar3 = _DAT_00157170;
  if (uVar6 < uVar10) {
    lVar11 = (uVar10 - uVar8) + -1;
    auVar13._8_4_ = (int)lVar11;
    auVar13._0_8_ = lVar11;
    auVar13._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar12 = 0;
    auVar13 = auVar13 ^ _DAT_00157190;
    do {
      auVar15._8_4_ = (int)uVar12;
      auVar15._0_8_ = uVar12;
      auVar15._12_4_ = (int)(uVar12 >> 0x20);
      auVar16 = (auVar15 | auVar4) ^ auVar5;
      iVar14 = auVar13._4_4_;
      if ((bool)(~(auVar16._4_4_ == iVar14 && auVar13._0_4_ < auVar16._0_4_ ||
                  iVar14 < auVar16._4_4_) & 1)) {
        *(undefined4 *)((long)pvVar7 + uVar12 * 8 + uVar8 * 8 + 4) = 0xffffffff;
      }
      if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
          auVar16._12_4_ <= auVar13._12_4_) {
        *(undefined4 *)((long)pvVar7 + uVar12 * 8 + uVar8 * 8 + 0xc) = 0xffffffff;
      }
      auVar15 = (auVar15 | auVar3) ^ auVar5;
      iVar17 = auVar15._4_4_;
      if (iVar17 <= iVar14 && (iVar17 != iVar14 || auVar15._0_4_ <= auVar13._0_4_)) {
        *(undefined4 *)((long)pvVar7 + uVar12 * 8 + uVar8 * 8 + 0x14) = 0xffffffff;
        *(undefined4 *)((long)pvVar7 + uVar12 * 8 + uVar8 * 8 + 0x1c) = 0xffffffff;
      }
      uVar12 = uVar12 + 4;
    } while (((uVar10 - uVar8) + 3 & 0xfffffffffffffffc) != uVar12);
  }
  L->stacksize = uVar10;
  L->base = (TValue *)((long)L->base + lVar9);
  L->top = (TValue *)((long)L->top + lVar9);
  for (uVar6 = (L->openupval).gcptr32; uVar6 != 0; uVar6 = *(uint *)(ulong)uVar6) {
    puVar1 = (uint *)(ulong)uVar6 + 4;
    *puVar1 = *puVar1 + (int)lVar9;
  }
  uVar8 = (ulong)(L->glref).ptr32;
  if ((lua_State *)(ulong)*(uint *)(uVar8 + 0xf4) == L) {
    piVar2 = (int *)(uVar8 + 0xf8);
    *piVar2 = *piVar2 + (int)lVar9;
  }
  return;
}

Assistant:

static void resizestack(lua_State *L, MSize n)
{
  TValue *st, *oldst = tvref(L->stack);
  ptrdiff_t delta;
  MSize oldsize = L->stacksize;
  MSize realsize = n + 1 + LJ_STACK_EXTRA;
  GCobj *up;
  lua_assert((MSize)(tvref(L->maxstack)-oldst)==L->stacksize-LJ_STACK_EXTRA-1);
  st = (TValue *)lj_mem_realloc(L, tvref(L->stack),
				(MSize)(L->stacksize*sizeof(TValue)),
				(MSize)(realsize*sizeof(TValue)));
  setmref(L->stack, st);
  delta = (char *)st - (char *)oldst;
  setmref(L->maxstack, st + n);
  while (oldsize < realsize)  /* Clear new slots. */
    setnilV(st + oldsize++);
  L->stacksize = realsize;
  L->base = (TValue *)((char *)L->base + delta);
  L->top = (TValue *)((char *)L->top + delta);
  for (up = gcref(L->openupval); up != NULL; up = gcnext(up))
    setmref(gco2uv(up)->v, (TValue *)((char *)uvval(gco2uv(up)) + delta));
  if (obj2gco(L) == gcref(G(L)->jit_L))
    setmref(G(L)->jit_base, mref(G(L)->jit_base, char) + delta);
}